

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,sockaddr *addr,uint addrlen,uint flags)

{
  int iVar1;
  int *piVar2;
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *other;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  int local_138 [2];
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> local_130;
  undefined1 local_120 [8];
  Promise<void> connected;
  Fault local_100;
  Fault f;
  undefined1 local_70 [8];
  String address;
  int error;
  Flags local_44;
  undefined1 local_40 [8];
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> result;
  uint flags_local;
  uint addrlen_local;
  sockaddr *addr_local;
  EventLoop *pEStack_18;
  int fd_local;
  LowLevelAsyncIoProviderImpl *this_local;
  
  pEStack_18 = (EventLoop *)CONCAT44(in_register_00000034,fd);
  addr_local._4_4_ = (int)addr;
  local_44 = OBSERVE_READ_WRITE;
  result.ptr._4_4_ = flags;
  this_local = this;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
            ((kj *)local_40,*(UnixEventPort **)&pEStack_18->running,(int *)((long)&addr_local + 4),
             (uint *)&result.ptr,&local_44);
  do {
    iVar1 = ::connect(addr_local._4_4_,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),
                      result.ptr._4_4_);
    if (-1 < iVar1) {
LAB_00816757:
      Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::operator->
                ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_40);
      AsyncStreamFd::waitConnected((AsyncStreamFd *)local_120);
      local_138[0] = addr_local._4_4_;
      other = mv<kj::Own<kj::(anonymous_namespace)::AsyncStreamFd,decltype(nullptr)>>
                        ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_40);
      Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::Own(&local_130,other);
      Promise<void>::
      then<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd(int,sockaddr_const*,unsigned_int,unsigned_int)::_lambda()_1_>
                ((Promise<void> *)this,(Type *)local_120);
      (anonymous_namespace)::LowLevelAsyncIoProviderImpl::
      wrapConnectingSocketFd(int,sockaddr_const*,unsigned_int,unsigned_int)::{lambda()#1}::~sockaddr
                ((_lambda___1_ *)local_138);
      connected.super_PromiseBase.node.ptr._4_4_ = 1;
      Promise<void>::~Promise((Promise<void> *)local_120);
      goto LAB_0081682b;
    }
    piVar2 = __errno_location();
    address.content.disposer._0_4_ = *piVar2;
    if ((int)address.content.disposer == 0x73) goto LAB_00816757;
  } while ((int)address.content.disposer == 4);
  SocketAddress::SocketAddress
            ((SocketAddress *)&f,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),result.ptr._4_4_
            );
  SocketAddress::toString((String *)local_70,(SocketAddress *)&f);
  kj::_::Debug::Fault::Fault<int,kj::String&>
            (&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x5e5,(int)address.content.disposer,"connect()","address",(String *)local_70);
  kj::_::Debug::Fault::~Fault(&local_100);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xfffffffffffffef0);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)this,
             (FixVoid<kj::Own<kj::AsyncIoStream>_> *)&stack0xfffffffffffffef0);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xfffffffffffffef0);
  connected.super_PromiseBase.node.ptr._4_4_ = 1;
  String::~String((String *)local_70);
LAB_0081682b:
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncIoStream>> wrapConnectingSocketFd(
      int fd, const struct sockaddr* addr, uint addrlen, uint flags = 0) override {
    // It's important that we construct the AsyncStreamFd first, so that `flags` are honored,
    // especially setting nonblocking mode and taking ownership.
    auto result = heap<AsyncStreamFd>(eventPort, fd, flags,
                                      UnixEventPort::FdObserver::OBSERVE_READ_WRITE);

    // Unfortunately connect() doesn't fit the mold of KJ_NONBLOCKING_SYSCALL, since it indicates
    // non-blocking using EINPROGRESS.
    for (;;) {
      if (::connect(fd, addr, addrlen) < 0) {
        int error = errno;
        if (error == EINPROGRESS) {
          // Fine.
          break;
        } else if (error != EINTR) {
          auto address = SocketAddress(addr, addrlen).toString();
          KJ_FAIL_SYSCALL("connect()", error, address) { break; }
          return Own<AsyncIoStream>();
        }
      } else {
        // no error
        break;
      }
    }

    auto connected = result->waitConnected();
    return connected.then([fd,stream=kj::mv(result)]() mutable -> Own<AsyncIoStream> {
      int err;
      socklen_t errlen = sizeof(err);
      KJ_SYSCALL(getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen));
      if (err != 0) {
        KJ_FAIL_SYSCALL("connect()", err) { break; }
      }
      return kj::mv(stream);
    });
  }